

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

int __thiscall
QPixmapStyle::styleHint
          (QPixmapStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  int in_ESI;
  QStyleHintReturn *in_stack_00000068;
  QWidget *in_stack_00000070;
  QStyleOption *in_stack_00000078;
  StyleHint in_stack_00000084;
  QCommonStyle *in_stack_00000088;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else if (in_ESI == 0x19) {
    local_4 = 0;
  }
  else {
    local_4 = QCommonStyle::styleHint
                        (in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000070,
                         in_stack_00000068);
  }
  return local_4;
}

Assistant:

int QPixmapStyle::styleHint(StyleHint hint, const QStyleOption *option,
                            const QWidget *widget, QStyleHintReturn *returnData) const
{
    switch (hint) {
    case SH_EtchDisabledText:
        return false;
    case SH_ComboBox_Popup:
        return false;
    default: ;
    }

    return QCommonStyle::styleHint(hint, option, widget, returnData);
}